

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

void Wln_ObjPrint(Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = Vec_IntEntry(&p->vTypes,iObj);
  switch(iVar1) {
  case 0:
  case 99:
    pcVar4 = (char *)0x0;
    break;
  case 1:
    pcVar4 = "pi";
    break;
  case 2:
    pcVar4 = "po";
    break;
  case 3:
    pcVar4 = "ci";
    break;
  case 4:
    pcVar4 = "co";
    break;
  case 5:
    pcVar4 = "fon";
    break;
  case 6:
    pcVar4 = "box";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/abcOper.h"
                  ,0xe7,"const char *Abc_OperName(int)");
  case 0xb:
    pcVar4 = "buf";
    break;
  case 0xc:
    pcVar4 = "~";
    break;
  case 0xd:
  case 0x1e:
    pcVar4 = "&";
    break;
  case 0xe:
  case 0x1f:
    pcVar4 = "~&";
    break;
  case 0xf:
  case 0x20:
    pcVar4 = "|";
    break;
  case 0x10:
  case 0x21:
    pcVar4 = "~|";
    break;
  case 0x11:
  case 0x22:
    pcVar4 = "^";
    break;
  case 0x12:
  case 0x23:
    pcVar4 = "~^";
    break;
  case 0x15:
    pcVar4 = "mux";
    break;
  case 0x16:
    pcVar4 = "maj";
    break;
  case 0x24:
    pcVar4 = "!";
    break;
  case 0x25:
    pcVar4 = "&&";
    break;
  case 0x27:
    pcVar4 = "||";
    break;
  case 0x29:
    pcVar4 = "^^";
    break;
  case 0x32:
    pcVar4 = "+";
    break;
  case 0x33:
  case 0x3a:
    pcVar4 = "-";
    break;
  case 0x34:
  case 0x35:
    pcVar4 = "*";
    break;
  case 0x36:
    pcVar4 = "/";
    break;
  case 0x37:
    pcVar4 = "mod";
    break;
  case 0x38:
    pcVar4 = "%";
    break;
  case 0x39:
    pcVar4 = "**";
    break;
  case 0x3b:
    pcVar4 = "sqrt";
    break;
  case 0x3e:
    pcVar4 = "<";
    break;
  case 0x3f:
    pcVar4 = "<=";
    break;
  case 0x40:
    pcVar4 = ">=";
    break;
  case 0x41:
    pcVar4 = ">";
    break;
  case 0x42:
    pcVar4 = "==";
    break;
  case 0x43:
    pcVar4 = "!=";
    break;
  case 0x44:
    pcVar4 = "<<";
    break;
  case 0x45:
    pcVar4 = ">>";
    break;
  case 0x46:
    pcVar4 = "<<<";
    break;
  case 0x47:
    pcVar4 = ">>>";
    break;
  case 0x48:
    pcVar4 = "rotL";
    break;
  case 0x49:
    pcVar4 = "rotR";
    break;
  case 0x4b:
    pcVar4 = "lut";
    break;
  case 0x4d:
    pcVar4 = "table";
    break;
  case 0x59:
    pcVar4 = "DFFRSE";
    break;
  case 0x5b:
    pcVar4 = "[:]";
    break;
  case 0x5c:
    pcVar4 = "{}";
    break;
  case 0x5d:
    pcVar4 = "zPad";
    break;
  case 0x5e:
    pcVar4 = "sExt";
    break;
  case 0x5f:
    pcVar4 = "=>";
    break;
  case 0x60:
    pcVar4 = "squar";
    break;
  case 0x61:
    pcVar4 = "const";
  }
  printf("Obj %6d : Type = %6s  Fanins = %d : ",iObj,pcVar4,(ulong)(uint)p->vFanins[iObj].nSize);
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    iVar1 = p->vFanins[iObj].nSize;
    if (iVar1 <= lVar6) break;
    paVar2 = &p->vFanins[iObj].field_2;
    if (iVar1 < 3) {
      piVar3 = paVar2->Array + lVar6;
    }
    else {
      piVar3 = (int *)((long)paVar2->pArray[0] + lVar5);
    }
    if (*piVar3 != 0) {
      printf("%5d ");
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 4;
  }
  putchar(10);
  return;
}

Assistant:

void Wln_ObjPrint( Wln_Ntk_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p, iObj);
    printf( "Obj %6d : Type = %6s  Fanins = %d : ", iObj, Abc_OperName(Type), Wln_ObjFaninNum(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, k )
        printf( "%5d ", iFanin );
    printf( "\n" );
}